

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O0

void __thiscall soplex::LPColSetBase<double>::clear(LPColSetBase<double> *this)

{
  long in_RDI;
  bool in_stack_0000000b;
  int in_stack_0000000c;
  VectorBase<double> *in_stack_00000010;
  undefined8 in_stack_ffffffffffffffd8;
  SVSetBase<double> *in_stack_ffffffffffffffe0;
  
  SVSetBase<double>::clear
            (in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  num((LPColSetBase<double> *)0x262982);
  VectorBase<double>::reDim(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
  num((LPColSetBase<double> *)0x2629aa);
  VectorBase<double>::reDim(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
  num((LPColSetBase<double> *)0x2629d3);
  VectorBase<double>::reDim(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
  DataArray<int>::clear((DataArray<int> *)(in_RDI + 0xb0));
  return;
}

Assistant:

void clear()
   {
      SVSetBase<R>::clear();
      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.clear();
   }